

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O1

void SetPointer(FState *state,PFunction *sym,int frame)

{
  MBFParamState *pMVar1;
  CodePointerAlias *pCVar2;
  ulong uVar3;
  uint uVar4;
  
  if (sym == (PFunction *)0x0) {
    state->ActionFunc = (VMFunction *)0x0;
  }
  else {
    state->ActionFunc = ((sym->Variants).Array)->Implementation;
    if (MBFCodePointers.Count != 0) {
      uVar4 = 0;
      pCVar2 = MBFCodePointers.Array;
      do {
        if (*(int *)&(sym->super_PSymbol).super_DObject.field_0x24 == (pCVar2->name).Index) {
          TArray<MBFParamState,_MBFParamState>::Grow(&MBFParamStates,1);
          pMVar1 = MBFParamStates.Array;
          uVar3 = (ulong)MBFParamStates.Count;
          MBFParamStates.Array[uVar3].state = state;
          pMVar1[uVar3].pointer = uVar4;
          MBFParamStates.Count = MBFParamStates.Count + 1;
          return;
        }
        uVar4 = uVar4 + 1;
        pCVar2 = pCVar2 + 1;
      } while (MBFCodePointers.Count != uVar4);
    }
  }
  return;
}

Assistant:

static void SetPointer(FState *state, PFunction *sym, int frame = 0)
{
	if (sym == NULL)
	{
		state->ClearAction();
		return;
	}
	else
	{
		state->SetAction(sym->Variants[0].Implementation);

		for (unsigned int i = 0; i < MBFCodePointers.Size(); i++)
		{
			if (sym->SymbolName == MBFCodePointers[i].name)
			{
				MBFParamState newstate;
				newstate.state = state;
				newstate.pointer = i;
				MBFParamStates.Push(newstate);
				break; // No need to cycle through the rest of the list.
			}
		}
	}
}